

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O2

segment_t * kiste::parse_command(segment_t *__return_storage_ptr__,string *line,size_t pos)

{
  segment_type type;
  bool bVar1;
  char *pcVar2;
  parse_error *ppVar3;
  size_t pos_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (line->_M_string_length == pos) {
    ppVar3 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(ppVar3,"Missing command after \'$\'");
LAB_001057d2:
    __cxa_throw(ppVar3,&parse_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar2 = (char *)std::__cxx11::string::at((ulong)line);
  if (*pcVar2 == '$') {
    __return_storage_ptr__->_end_pos = pos;
    __return_storage_ptr__->_type = text;
    pcVar2 = "$";
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::at((ulong)line);
    if (*pcVar2 == '%') {
      __return_storage_ptr__->_end_pos = pos;
      __return_storage_ptr__->_type = text;
      pcVar2 = "%";
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)line);
      if (*pcVar2 != '|') {
        pcVar2 = (char *)std::__cxx11::string::at((ulong)line);
        if (*pcVar2 == '{') {
          pos_00 = pos + 1;
          type = escape;
        }
        else {
          std::__cxx11::string::substr((ulong)&bStack_68,(ulong)line);
          bVar1 = std::operator==(&bStack_68,"raw{");
          std::__cxx11::string::~string((string *)&bStack_68);
          if (bVar1) {
            pos_00 = pos + 4;
            type = raw;
          }
          else {
            std::__cxx11::string::substr((ulong)&bStack_68,(ulong)line);
            bVar1 = std::operator==(&bStack_68,"call{");
            std::__cxx11::string::~string((string *)&bStack_68);
            if (!bVar1) {
              ppVar3 = (parse_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::substr((ulong)&local_48,(ulong)line);
              std::operator+(&bStack_68,"Unknown command: ",&local_48);
              parse_error::parse_error(ppVar3,&bStack_68);
              __cxa_throw(ppVar3,&parse_error::typeinfo,std::runtime_error::~runtime_error);
            }
            pos_00 = pos + 5;
            type = call;
          }
        }
        parse_expression(__return_storage_ptr__,line,type,pos_00);
        return __return_storage_ptr__;
      }
      if (line->_M_string_length - 1 != pos) {
        ppVar3 = (parse_error *)__cxa_allocate_exception(0x10);
        parse_error::parse_error(ppVar3,"Trailing characters after trim-right ($|)");
        goto LAB_001057d2;
      }
      __return_storage_ptr__->_end_pos = pos;
      __return_storage_ptr__->_type = trim_trailing_return;
      pcVar2 = "";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__return_storage_ptr__->_text,pcVar2,(allocator<char> *)&bStack_68);
  return __return_storage_ptr__;
}

Assistant:

auto parse_command(const std::string& line, std::size_t pos) -> segment_t
  {
    // std::clog << "----------------------------------" << std::endl;
    // std::clog << "line: " << line.substr(pos) << std::endl;
    if (pos == line.size())
    {
      throw parse_error("Missing command after '$'");
    }
    else if (line.at(pos) == '$')
    {
      return {pos, segment_type::text, "$"};
    }
    else if (line.at(pos) == '%')
    {
      return {pos, segment_type::text, "%"};
    }
    else if (line.at(pos) == '|')
    {
      if (pos != line.size() - 1)
      {
        throw parse_error("Trailing characters after trim-right ($|)");
      }
      return {pos, segment_type::trim_trailing_return, ""};
    }
    else if (line.at(pos) == '{')
    {
      return parse_expression(line, segment_type::escape, pos + 1);
    }
    else if (line.substr(pos, 4) == "raw{")
    {
      return parse_expression(line, segment_type::raw, pos + 4);
    }
    else if (line.substr(pos, 5) == "call{")
    {
      return parse_expression(line, segment_type::call, pos + 5);
    }
    else
    {
      throw parse_error("Unknown command: " + line.substr(pos));
    }
  }